

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

size_t __thiscall pbrt::Scene::saveTo(Scene *this,ostream *outStream)

{
  size_t sVar1;
  SP sp;
  BinaryWriter binary;
  SP local_b0;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  BinaryWriter local_90;
  
  BinaryWriter::BinaryWriter(&local_90,outStream);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Entity,void>
            ((__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (__weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_Entity).super_enable_shared_from_this<pbrt::Entity>);
  local_b0.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a0;
  local_b0.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_98
  ;
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_98->_M_use_count = local_98->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_98->_M_use_count = local_98->_M_use_count + 1;
    }
  }
  BinaryWriter::serialize(&local_90,&local_b0);
  if (local_b0.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  sVar1 = std::ostream::tellp();
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  std::
  _Rb_tree<std::shared_ptr<pbrt::Entity>,_std::pair<const_std::shared_ptr<pbrt::Entity>,_int>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::Entity>,_int>_>,_std::less<std::shared_ptr<pbrt::Entity>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Entity>,_int>_>_>
  ::~_Rb_tree(&local_90.emittedEntity._M_t);
  std::
  deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ::~deque((deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
            *)&local_90);
  return sVar1;
}

Assistant:

size_t Scene::saveTo(std::ostream &outStream)
  {
    BinaryWriter binary(outStream);
    Entity::SP sp = shared_from_this();
    binary.serialize(sp);
    return binary.binStream.tellp();
  }